

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::type_t> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>::
alloc<std::function<cs_impl::any()>const&,std::type_index_const&,std::shared_ptr<cs::name_space>&>
          (allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>
           *this,function<cs_impl::any_()> *args,type_index *args_1,
          shared_ptr<cs::name_space> *args_2)

{
  long lVar1;
  holder<cs::type_t> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<cs::type_t> *)operator_new(0x48);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<cs::type_t> **)(this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<cs::type_t>::
  holder<std::function<cs_impl::any()>const&,std::type_index_const&,std::shared_ptr<cs::name_space>&>
            (this_00,args,args_1,args_2);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}